

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sshpubk.c
# Opt level: O2

LoadFileStatus lf_load_fp(LoadedFile *lf,FILE *fp)

{
  int iVar1;
  size_t sVar2;
  ulong uVar3;
  LoadFileStatus LVar4;
  ulong uVar5;
  
  uVar5 = 0;
  do {
    lf->len = uVar5;
    uVar3 = lf->max_size;
    if (uVar3 < uVar5 || uVar3 - uVar5 == 0) {
LAB_0011fc62:
      LVar4 = LF_OK;
      if (uVar5 == uVar3) {
        iVar1 = fgetc((FILE *)fp);
        LVar4 = (LoadFileStatus)(iVar1 != -1);
        uVar5 = lf->len;
      }
      lf->binarysource_[0].data = lf->data;
      lf->binarysource_[0].len = uVar5;
      lf->binarysource_[0].pos = 0;
      lf->binarysource_[0].err = BSE_NO_ERROR;
      lf->binarysource_[0].binarysource_ = lf->binarysource_;
      return LVar4;
    }
    sVar2 = fread(lf->data + uVar5,1,uVar3 - uVar5,(FILE *)fp);
    iVar1 = ferror((FILE *)fp);
    if (iVar1 != 0) {
      return LF_ERROR;
    }
    uVar5 = lf->len;
    if (sVar2 == 0) {
      uVar3 = lf->max_size;
      goto LAB_0011fc62;
    }
    uVar5 = uVar5 + sVar2;
  } while( true );
}

Assistant:

LoadFileStatus lf_load_fp(LoadedFile *lf, FILE *fp)
{
    lf->len = 0;
    while (lf->len < lf->max_size) {
        size_t retd = fread(lf->data + lf->len, 1, lf->max_size - lf->len, fp);
        if (ferror(fp))
            return LF_ERROR;

        if (retd == 0)
            break;

        lf->len += retd;
    }

    LoadFileStatus status = LF_OK;

    if (lf->len == lf->max_size) {
        /* The file might be too long to fit in our fixed-size
         * structure. Try reading one more byte, to check. */
        if (fgetc(fp) != EOF)
            status = LF_TOO_BIG;
    }

    BinarySource_INIT(lf, lf->data, lf->len);

    return status;
}